

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::transform
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,AffineSpace3fa *space)

{
  _func_int **pp_Var1;
  LightNodeImpl<embree::SceneGraph::AmbientLight> *in_RDI;
  AffineSpace3fa *in_stack_ffffffffffffff80;
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  
  this_00 = in_RDI;
  pp_Var1 = (_func_int **)operator_new(0x179527);
  AmbientLight::transform((AmbientLight *)in_RDI,in_stack_ffffffffffffff80);
  LightNodeImpl(this_00,(AmbientLight *)in_RDI);
  (in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this_00->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }